

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2_smt.c
# Opt level: O1

MPP_RET bits_model_smt_deinit(RcModelV2SmtCtx *ctx)

{
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2_smt","enter %p\n","bits_model_smt_deinit",ctx);
  }
  if (ctx->qp_p != (MppData *)0x0) {
    mpp_data_deinit(ctx->qp_p);
    ctx->qp_p = (MppData *)0x0;
  }
  if (ctx->motion_level != (MppDataV2 *)0x0) {
    mpp_data_deinit_v2(ctx->motion_level);
    ctx->motion_level = (MppDataV2 *)0x0;
  }
  if (ctx->complex_level != (MppDataV2 *)0x0) {
    mpp_data_deinit_v2(ctx->complex_level);
    ctx->complex_level = (MppDataV2 *)0x0;
  }
  if (ctx->stat_bits != (MppDataV2 *)0x0) {
    mpp_data_deinit_v2(ctx->stat_bits);
    ctx->stat_bits = (MppDataV2 *)0x0;
  }
  if (ctx->rt_bits != (MppDataV2 *)0x0) {
    mpp_data_deinit_v2(ctx->rt_bits);
    ctx->rt_bits = (MppDataV2 *)0x0;
  }
  if (ctx->pid_lower_p != (MppDataV2 *)0x0) {
    mpp_data_deinit_v2(ctx->pid_lower_p);
    ctx->pid_lower_p = (MppDataV2 *)0x0;
  }
  if (ctx->pid_upper_p != (MppDataV2 *)0x0) {
    mpp_data_deinit_v2(ctx->pid_upper_p);
    ctx->pid_upper_p = (MppDataV2 *)0x0;
  }
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2_smt","leave %p\n","bits_model_smt_deinit",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET bits_model_smt_deinit(RcModelV2SmtCtx *ctx)
{
    rc_dbg_func("enter %p\n", ctx);

    if (ctx->qp_p) {
        mpp_data_deinit(ctx->qp_p);
        ctx->qp_p = NULL;
    }

    if (ctx->motion_level != NULL) {
        mpp_data_deinit_v2(ctx->motion_level);
        ctx->motion_level = NULL;
    }

    if (ctx->complex_level != NULL) {
        mpp_data_deinit_v2(ctx->complex_level);
        ctx->complex_level = NULL;
    }

    if (ctx->stat_bits != NULL) {
        mpp_data_deinit_v2(ctx->stat_bits);
        ctx->stat_bits = NULL;
    }

    if (ctx->rt_bits != NULL) {
        mpp_data_deinit_v2(ctx->rt_bits);
        ctx->rt_bits = NULL;
    }

    if (ctx->pid_lower_p != NULL) {
        mpp_data_deinit_v2(ctx->pid_lower_p);
        ctx->pid_lower_p = NULL;
    }

    if (ctx->pid_upper_p != NULL) {
        mpp_data_deinit_v2(ctx->pid_upper_p);
        ctx->pid_upper_p = NULL;
    }

    rc_dbg_func("leave %p\n", ctx);
    return MPP_OK;
}